

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::freeAll(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  bool bVar1;
  long in_RDI;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *unaff_retaddr;
  
  if (*(long *)(in_RDI + 0x2a8) != 0) {
    spx_free<int*>((int **)0x6cc1c6);
  }
  if (*(long *)(in_RDI + 0x2a0) != 0) {
    spx_free<int*>((int **)0x6cc1ea);
  }
  if (*(long *)(in_RDI + 0x2b8) != 0) {
    spx_free<int*>((int **)0x6cc212);
  }
  if (*(long *)(in_RDI + 0x2b0) != 0) {
    spx_free<int*>((int **)0x6cc236);
  }
  if (*(long *)(in_RDI + 0x378) != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              ((Dring **)0x6cc25e);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x6cc294);
  }
  if (*(long *)(in_RDI + 0x3a0) != 0) {
    spx_free<int*>((int **)0x6cc2bc);
  }
  if (*(long *)(in_RDI + 0x3a8) != 0) {
    spx_free<int*>((int **)0x6cc2e4);
  }
  if (*(long *)(in_RDI + 0x3b0) != 0) {
    spx_free<int*>((int **)0x6cc30c);
  }
  if (*(long *)(in_RDI + 0x3b8) != 0) {
    spx_free<int*>((int **)0x6cc334);
  }
  if (*(long *)(in_RDI + 0x3d8) != 0) {
    spx_free<soplex::CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Dring*>
              ((Dring **)0x6cc360);
  }
  if (*(long *)(in_RDI + 1000) != 0) {
    spx_free<int*>((int **)0x6cc38c);
  }
  if (*(long *)(in_RDI + 0x408) != 0) {
    spx_free<int*>((int **)0x6cc3b8);
  }
  if (*(long *)(in_RDI + 0x410) != 0) {
    spx_free<int*>((int **)0x6cc3e4);
  }
  if (*(long *)(in_RDI + 0x418) != 0) {
    spx_free<int*>((int **)0x6cc410);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x6cc446);
  }
  if (*(long *)(in_RDI + 0x2e0) != 0) {
    spx_free<int*>((int **)0x6cc46e);
  }
  if (*(long *)(in_RDI + 0x2f8) != 0) {
    spx_free<int*>((int **)0x6cc496);
  }
  if (*(long *)(in_RDI + 0x300) != 0) {
    spx_free<int*>((int **)0x6cc4be);
  }
  bVar1 = std::
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::empty(unaff_retaddr);
  if (!bVar1) {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::clear((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *)0x6cc4fc);
  }
  if (*(long *)(in_RDI + 0x328) != 0) {
    spx_free<int*>((int **)0x6cc524);
  }
  if (*(long *)(in_RDI + 0x330) != 0) {
    spx_free<int*>((int **)0x6cc54c);
  }
  if (*(long *)(in_RDI + 0x338) != 0) {
    spx_free<int*>((int **)0x6cc574);
  }
  if (*(long *)(in_RDI + 0x340) != 0) {
    spx_free<int*>((int **)0x6cc59f);
  }
  if (*(long *)(in_RDI + 0x748) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x748))();
    spx_free<soplex::Timer*>((Timer **)0x6cc5d0);
  }
  if (*(long *)(in_RDI + 0x428) != 0) {
    (**(code **)**(undefined8 **)(in_RDI + 0x428))();
    spx_free<soplex::Timer*>((Timer **)0x6cc605);
  }
  return;
}

Assistant:

void SLUFactor<R>::freeAll()
{

   if(this->row.perm)
      spx_free(this->row.perm);

   if(this->row.orig)
      spx_free(this->row.orig);

   if(this->col.perm)
      spx_free(this->col.perm);

   if(this->col.orig)
      spx_free(this->col.orig);

   if(this->u.row.elem)
      spx_free(this->u.row.elem);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.row.start)
      spx_free(this->u.row.start);

   if(this->u.row.len)
      spx_free(this->u.row.len);

   if(this->u.row.max)
      spx_free(this->u.row.max);

   if(this->u.col.elem)
      spx_free(this->u.col.elem);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->u.col.start)
      spx_free(this->u.col.start);

   if(this->u.col.len)
      spx_free(this->u.col.len);

   if(this->u.col.max)
      spx_free(this->u.col.max);

   if(!this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);


   if(!this->u.col.val.empty())
      this->u.col.val.clear();

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(solveTime)
   {
      solveTime->~Timer();
      spx_free(solveTime);
   }

   if(this->factorTime)
   {
      this->factorTime->~Timer();
      spx_free(this->factorTime);
   }
}